

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::OptConstFoldBinaryWasm<int>
          (GlobOpt *this,Instr **pInstr,Value *src1,Value *src2,Value **pDstVal)

{
  Instr *pIVar1;
  bool bVar2;
  bool bVar3;
  JITTimeFunctionBody *this_00;
  Opnd *this_01;
  RegOpnd *dst;
  long local_48;
  int64 tmpValueOut;
  int local_38;
  int src1IntConstantValue;
  int src2IntConstantValue;
  
  bVar2 = DoConstFold(this);
  if ((bVar2) && (src1 != (Value *)0x0)) {
    bVar3 = ValueInfo::TryGetIntConstantValue
                      (src1->valueInfo,(int32 *)((long)&tmpValueOut + 4),false);
    bVar2 = false;
    if ((src2 != (Value *)0x0) && (bVar2 = false, bVar3)) {
      bVar2 = false;
      bVar3 = ValueInfo::TryGetIntConstantValue(src2->valueInfo,&local_38,false);
      if (bVar3) {
        pIVar1 = *pInstr;
        src1IntConstantValue = local_38;
        this_00 = Func::GetJITFunctionBody(this->func);
        bVar2 = JITTimeFunctionBody::IsWasmFunction(this_00);
        bVar2 = IR::Instr::BinaryCalculatorT<int>
                          (pIVar1,tmpValueOut._4_4_,src1IntConstantValue,&local_48,bVar2);
        if (bVar2) {
          CaptureByteCodeSymUses(this,*pInstr);
          bVar3 = IR::Opnd::IsInt64((*pInstr)->m_dst);
          if (bVar3) {
            this_01 = ReplaceWConst<long>(this,pInstr,local_48,pDstVal);
          }
          else {
            this_01 = ReplaceWConst<int>(this,pInstr,(int)local_48,pDstVal);
          }
          pIVar1 = *pInstr;
          pIVar1->m_opcode = Ld_I4;
          dst = IR::Opnd::AsRegOpnd(this_01);
          ToInt32Dst(this,pIVar1,dst,this->currentBlock);
        }
      }
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool GlobOpt::OptConstFoldBinaryWasm(
    IR::Instr** pInstr,
    const Value* src1,
    const Value* src2,
    Value **pDstVal)
{
    IR::Instr* &instr = *pInstr;

    if (!DoConstFold())
    {
        return false;
    }

    T src1IntConstantValue, src2IntConstantValue;
    if (!src1 || !src1->GetValueInfo()->TryGetIntConstantValue(&src1IntConstantValue, false) || //a bit sketchy: false for int32 means likelyInt = false
        !src2 || !src2->GetValueInfo()->TryGetIntConstantValue(&src2IntConstantValue, false)    //and unsigned = false for int64
        )
    {
        return false;
    }

    int64 tmpValueOut;
    if (!instr->BinaryCalculatorT<T>(src1IntConstantValue, src2IntConstantValue, &tmpValueOut, func->GetJITFunctionBody()->IsWasmFunction()))
    {
        return false;
    }

    this->CaptureByteCodeSymUses(instr);

    IR::Opnd *dst = (instr->GetDst()->IsInt64()) ? //dst can be int32 for int64 comparison operators
        ReplaceWConst(pInstr, tmpValueOut, pDstVal) :
        ReplaceWConst(pInstr, (int)tmpValueOut, pDstVal);

    instr->m_opcode = Js::OpCode::Ld_I4;
    this->ToInt32Dst(instr, dst->AsRegOpnd(), this->currentBlock);
    return true;
}